

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O2

void __thiscall suisha::t_loop::f_post(t_loop *this,function<void_()> *a_function)

{
  function<void_()> *this_00;
  function<void_()> *p;
  
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,a_function);
  p = this_00;
  write(*(int *)(this + 0x28),&p,8);
  return;
}

Assistant:

void f_post(std::function<void()>&& a_function)
	{
		auto p = new std::function<void()>(std::move(a_function));
		write(v_post, &p, sizeof(p));
	}